

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O2

void __thiscall
cmTargetPropCommandBase::HandleInterfaceContent
          (cmTargetPropCommandBase *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool param_4)

{
  cmValue __rhs;
  undefined7 in_register_00000009;
  string totalContent;
  string propName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((int)CONCAT71(in_register_00000009,prepend) == 0) {
    std::operator+(&local_80,"INTERFACE_",&this->Property);
    (*this->_vptr_cmTargetPropCommandBase[6])(&local_a0,this,content);
    local_60.field_2._M_local_buf[0] = '\0';
    cmTarget::AppendProperty
              (tgt,&local_80,&local_a0,(optional<cmListFileBacktrace> *)&local_60,false);
    std::_Optional_payload_base<cmListFileBacktrace>::_M_reset
              ((_Optional_payload_base<cmListFileBacktrace> *)&local_60);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"INTERFACE_",(allocator<char> *)&local_60);
    std::operator+(&local_80,&local_a0,&this->Property);
    std::__cxx11::string::~string((string *)&local_a0);
    __rhs = cmTarget::GetProperty(tgt,&local_80);
    (*this->_vptr_cmTargetPropCommandBase[6])(&local_60,this,content);
    if (__rhs.Value == (string *)0x0) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      local_40._M_string_length = 0;
      local_40.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::operator+(&local_40,";",__rhs.Value);
    }
    std::operator+(&local_a0,&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    cmTarget::SetProperty(tgt,&local_80,&local_a0);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void cmTargetPropCommandBase::HandleInterfaceContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool prepend, bool)
{
  if (prepend) {
    const std::string propName = std::string("INTERFACE_") + this->Property;
    cmValue propValue = tgt->GetProperty(propName);
    const std::string totalContent =
      this->Join(content) + (propValue ? (";" + *propValue) : std::string());
    tgt->SetProperty(propName, totalContent);
  } else {
    tgt->AppendProperty("INTERFACE_" + this->Property, this->Join(content));
  }
}